

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd.c
# Opt level: O3

void NJD_clear(NJD *njd)

{
  _NJDNode *p_Var1;
  NJDNode *node;
  
  node = njd->head;
  while (node != (NJDNode *)0x0) {
    p_Var1 = node->next;
    NJDNode_clear(node);
    free(njd->head);
    njd->head = p_Var1;
    node = p_Var1;
  }
  njd->tail = (NJDNode *)0x0;
  return;
}

Assistant:

void NJD_clear(NJD * njd)
{
   NJDNode *node;

   while (njd->head != NULL) {
      node = njd->head->next;
      NJDNode_clear(njd->head);
      free(njd->head);
      njd->head = node;
   }
   njd->tail = NULL;
}